

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

mstate init_user_mstate(char *tbase,size_t tsize)

{
  char *pcVar1;
  mstate m_00;
  ulong local_48;
  mstate m;
  mchunkptr msp;
  mchunkptr mn;
  size_t msize;
  size_t tsize_local;
  char *tbase_local;
  
  if (((ulong)(tbase + 0x10) & 0xf) == 0) {
    local_48 = 0;
  }
  else {
    local_48 = 0x10 - ((ulong)(tbase + 0x10) & 0xf) & 0xf;
  }
  m_00 = (mstate)(tbase + local_48 + 0x10);
  memset(m_00,0,0x3b0);
  pcVar1 = tbase + local_48 + 8;
  pcVar1[0] = -0x4d;
  pcVar1[1] = '\x03';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  *(char **)(tbase + local_48 + 0x28) = tbase;
  *(char **)(tbase + local_48 + 0x388) = tbase;
  *(size_t *)(tbase + local_48 + 0x370) = tsize;
  *(size_t *)(tbase + local_48 + 0x368) = tsize;
  *(size_t *)(tbase + local_48 + 0x390) = tsize;
  *(size_t *)(tbase + local_48 + 0x50) = mparams.magic;
  pcVar1 = tbase + local_48 + 0x48;
  pcVar1[0] = -1;
  pcVar1[1] = '\x0f';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  *(flag_t *)(tbase + local_48 + 0x380) = mparams.default_mflags;
  pcVar1 = tbase + local_48 + 0x3a8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1 = tbase + local_48 + 0x3b0;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  *(uint *)(tbase + local_48 + 0x380) = *(uint *)(tbase + local_48 + 0x380) | 4;
  init_bins(m_00);
  init_top(m_00,(mchunkptr)
                (tbase + (*(ulong *)(tbase + local_48 + 8) & 0xfffffffffffffff8) + local_48),
           (size_t)(tbase + (tsize - (long)(tbase + (*(ulong *)(tbase + local_48 + 8) &
                                                    0xfffffffffffffff8) + local_48)) + -0x50));
  return m_00;
}

Assistant:

static mstate init_user_mstate(char* tbase, size_t tsize) {
  size_t msize = pad_request(sizeof(struct malloc_state));
  mchunkptr mn;
  mchunkptr msp = align_as_chunk(tbase);
  mstate m = (mstate)(chunk2mem(msp));
  memset(m, 0, msize);
  (void)INITIAL_LOCK(&m->mutex);
  msp->head = (msize|INUSE_BITS);
  m->seg.base = m->least_addr = tbase;
  m->seg.size = m->footprint = m->max_footprint = tsize;
  m->magic = mparams.magic;
  m->release_checks = MAX_RELEASE_CHECK_RATE;
  m->mflags = mparams.default_mflags;
  m->extp = 0;
  m->exts = 0;
  disable_contiguous(m);
  init_bins(m);
  mn = next_chunk(mem2chunk(m));
  init_top(m, mn, (size_t)((tbase + tsize) - (char*)mn) - TOP_FOOT_SIZE);
  check_top_chunk(m, m->top);
  return m;
}